

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player_terminator.h
# Opt level: O3

int __thiscall
PlayerTerminator::move(PlayerTerminator *this,vector<Move,_std::allocator<Move>_> *moveHistory)

{
  pointer *ppMVar1;
  int iVar2;
  Move MVar3;
  vector<Move,_std::allocator<Move>_> *pvVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  pointer pMVar12;
  ulong uVar14;
  int *piVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  vector<Move,_std::allocator<Move>_> invertedMoveHistory;
  PlayerNext next;
  PlayerCycle_3 cycle_3;
  PlayerCopy copy;
  PlayerDelay delay;
  PlayerDelay_2 delay_2;
  int local_16c;
  vector<Move,_std::allocator<Move>_> local_168;
  ulong local_148;
  ulong local_140;
  ulong local_138;
  Move local_130;
  undefined **local_128;
  undefined1 *local_120;
  undefined1 local_118 [8];
  undefined1 local_110 [16];
  int local_100;
  undefined1 local_f8 [8];
  _Alloc_hider local_f0;
  _func_int *local_e8;
  char local_e0 [16];
  int local_d0;
  undefined **local_c8;
  undefined1 *local_c0;
  undefined1 local_b8 [8];
  undefined1 local_b0 [16];
  int local_a0 [2];
  undefined1 local_98 [8];
  _Alloc_hider local_90;
  char local_80 [16];
  undefined1 local_70 [8];
  _Alloc_hider local_68;
  char local_58 [16];
  vector<Move,_std::allocator<Move>_> *local_48;
  ulong local_40;
  ulong local_38;
  ulong uVar13;
  
  local_128 = (undefined **)local_118;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"terminator","");
  local_98 = (undefined1  [8])&PTR__Player_0010c820;
  local_90._M_p = local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,local_128,(undefined1 *)((long)local_128 + (long)local_120));
  local_98 = (undefined1  [8])&PTR__Player_0010cc88;
  if (local_128 != (undefined **)local_118) {
    operator_delete(local_128);
  }
  local_128 = (undefined **)local_118;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"terminator","");
  local_70 = (undefined1  [8])&PTR__Player_0010c820;
  local_68._M_p = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,local_128,(undefined1 *)((long)local_128 + (long)local_120));
  local_70 = (undefined1  [8])&PTR__Player_0010cd08;
  if (local_128 != (undefined **)local_118) {
    operator_delete(local_128);
  }
  local_c8 = (undefined **)local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"terminator","");
  local_128 = &PTR__Player_0010c820;
  local_120 = local_110;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_120,local_c8,(undefined1 *)((long)local_c8 + (long)local_c0));
  local_128 = &PTR__Player_0010c9c8;
  local_100 = 0;
  if (local_c8 != (undefined **)local_b8) {
    operator_delete(local_c8);
  }
  local_f8 = (undefined1  [8])&local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"terminator","");
  local_c8 = &PTR__Player_0010c820;
  local_c0 = local_b0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,local_f8,local_f0._M_p + (long)local_f8);
  local_c8 = &PTR__Player_0010c988;
  local_a0[0] = 0;
  if (local_f8 != (undefined1  [8])&local_e8) {
    operator_delete((void *)local_f8);
  }
  ppMVar1 = &local_168.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  local_168.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)ppMVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"terminator","");
  local_f8 = (undefined1  [8])&PTR__Player_0010c820;
  local_f0._M_p = local_e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,
             local_168.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
             super__Vector_impl_data._M_start,
             (undefined1 *)
             ((long)&(local_168.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                      super__Vector_impl_data._M_start)->m_me +
             (long)&(local_168.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                     super__Vector_impl_data._M_finish)->m_me));
  local_f8 = (undefined1  [8])&PTR__Player_0010c948;
  local_d0 = rand();
  local_d0 = local_d0 % 3;
  if (local_168.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)ppMVar1) {
    operator_delete(local_168.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_168.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data._M_start
       = (Move *)0x0;
  local_168.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
  _M_finish = (Move *)0x0;
  local_168.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (Move *)0x0;
  std::vector<Move,_std::allocator<Move>_>::reserve
            (&local_168,
             (long)(moveHistory->super__Vector_base<Move,_std::allocator<Move>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(moveHistory->super__Vector_base<Move,_std::allocator<Move>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  if ((moveHistory->super__Vector_base<Move,_std::allocator<Move>_>)._M_impl.super__Vector_impl_data
      ._M_finish ==
      (moveHistory->super__Vector_base<Move,_std::allocator<Move>_>)._M_impl.super__Vector_impl_data
      ._M_start) {
LAB_00106adc:
    iVar5 = PlayerDelay::move((PlayerDelay *)local_98,moveHistory);
  }
  else {
    local_148 = 0;
    local_140 = 0;
    local_138 = 0;
    uVar18 = 0;
    uVar13 = 0;
    uVar17 = 0;
    local_48 = moveHistory;
    do {
      pvVar4 = local_48;
      iVar5 = PlayerDelay::move((PlayerDelay *)local_98,&local_168);
      iVar6 = PlayerDelay_2::move((PlayerDelay_2 *)local_70,&local_168);
      local_38 = uVar13;
      if (local_168.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_168.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        local_16c = local_100;
        pMVar12 = local_168.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      else {
        local_16c = beats(local_168.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                          super__Vector_impl_data._M_finish[-1].m_you);
        pMVar12 = local_168.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                  super__Vector_impl_data._M_start;
      }
      local_40 = uVar17;
      piVar15 = &local_168.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1].m_you;
      if (local_168.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
          _M_finish == pMVar12) {
        piVar15 = local_a0;
      }
      iVar2 = *piVar15;
      iVar7 = PlayerCycle_3::move((PlayerCycle_3 *)local_f8,&local_168);
      pMVar12 = (pvVar4->super__Vector_base<Move,_std::allocator<Move>_>)._M_impl.
                super__Vector_impl_data._M_start;
      local_130.m_me = pMVar12[uVar18].m_you;
      bVar19 = iVar5 == local_130.m_me;
      bVar20 = iVar6 == local_130.m_me;
      bVar21 = local_16c == local_130.m_me;
      bVar22 = iVar2 == local_130.m_me;
      bVar23 = iVar7 == local_130.m_me;
      local_130.m_you = pMVar12[uVar18].m_me;
      if (local_168.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_168.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<Move,_std::allocator<Move>_>::_M_realloc_insert<Move>
                  (&local_168,
                   (iterator)
                   local_168.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_130);
      }
      else {
        MVar3.m_you = local_130.m_you;
        MVar3.m_me = local_130.m_me;
        *local_168.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
         _M_finish = MVar3;
        local_168.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_168.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      uVar8 = (int)local_148 + (uint)bVar19;
      local_148 = (ulong)uVar8;
      uVar9 = (int)local_140 + (uint)bVar20;
      local_140 = (ulong)uVar9;
      uVar10 = (int)local_138 + (uint)bVar21;
      local_138 = (ulong)uVar10;
      uVar16 = (int)local_40 + (uint)bVar22;
      uVar17 = (ulong)uVar16;
      uVar11 = (int)local_38 + (uint)bVar23;
      uVar13 = (ulong)uVar11;
      uVar18 = uVar18 + 1;
      uVar14 = (long)(local_48->super__Vector_base<Move,_std::allocator<Move>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(local_48->super__Vector_base<Move,_std::allocator<Move>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 3;
    } while (uVar18 < uVar14);
    if (uVar14 < uVar11 * 2) {
      iVar5 = PlayerCycle_3::move((PlayerCycle_3 *)local_f8,&local_168);
    }
    else if (uVar14 < uVar10 * 2) {
      iVar5 = local_100;
      if (local_168.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
          _M_finish !=
          local_168.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        iVar5 = beats(local_168.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                      super__Vector_impl_data._M_finish[-1].m_you);
      }
    }
    else if (uVar14 < uVar9 * 2) {
      iVar5 = PlayerDelay_2::move((PlayerDelay_2 *)local_70,&local_168);
    }
    else if (uVar14 < uVar8 * 2) {
      iVar5 = PlayerDelay::move((PlayerDelay *)local_98,&local_168);
    }
    else {
      moveHistory = local_48;
      if (uVar16 * 2 <= uVar14) goto LAB_00106adc;
      piVar15 = &local_168.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1].m_you;
      if (local_168.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_168.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        piVar15 = local_a0;
      }
      iVar5 = *piVar15;
    }
    iVar5 = beats(iVar5);
  }
  if (local_168.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
      _M_start != (Move *)0x0) {
    operator_delete(local_168.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_f8 = (undefined1  [8])&PTR__Player_0010c820;
  if (local_f0._M_p != local_e0) {
    operator_delete(local_f0._M_p);
  }
  local_c8 = &PTR__Player_0010c820;
  if (local_c0 != local_b0) {
    operator_delete(local_c0);
  }
  local_128 = &PTR__Player_0010c820;
  if (local_120 != local_110) {
    operator_delete(local_120);
  }
  local_70 = (undefined1  [8])&PTR__Player_0010c820;
  if (local_68._M_p != local_58) {
    operator_delete(local_68._M_p);
  }
  local_98 = (undefined1  [8])&PTR__Player_0010c820;
  if (local_90._M_p != local_80) {
    operator_delete(local_90._M_p);
  }
  return iVar5;
}

Assistant:

int move(const std::vector<Move>& moveHistory)
   {
      PlayerDelay   delay("terminator");
      PlayerDelay_2 delay_2("terminator");
      PlayerNext    next("terminator", 0);
      PlayerCopy    copy("terminator", 0);
      PlayerCycle_3 cycle_3("terminator");

      // Loop over all the moves played so far, and count the number of times
      // the move played by the opponent matches that predicted by our local
      // instantiation of DELAY.
      std::vector<Move> invertedMoveHistory;
      invertedMoveHistory.reserve(moveHistory.size());   // Optimization
      unsigned int correctDelay   = 0;
      unsigned int correctDelay_2 = 0;
      unsigned int correctNext    = 0;
      unsigned int correctCopy    = 0;
      unsigned int correctCycle_3 = 0;
      for (size_t i=0; i<moveHistory.size(); ++i)
      {
         const int predictedMoveDelay   = delay.move(invertedMoveHistory);
         const int predictedMoveDelay_2 = delay_2.move(invertedMoveHistory);
         const int predictedMoveNext    = next.move(invertedMoveHistory);
         const int predictedMoveCopy    = copy.move(invertedMoveHistory);
         const int predictedMoveCycle_3 = cycle_3.move(invertedMoveHistory);
         const Move& playedMove = moveHistory[i];

         if (predictedMoveDelay == playedMove.m_you)
         {
            correctDelay += 1;
         }
         if (predictedMoveDelay_2 == playedMove.m_you)
         {
            correctDelay_2 += 1;
         }
         if (predictedMoveNext == playedMove.m_you)
         {
            correctNext += 1;
         }
         if (predictedMoveCopy == playedMove.m_you)
         {
            correctCopy += 1;
         }
         if (predictedMoveCycle_3 == playedMove.m_you)
         {
            correctCycle_3 += 1;
         }

         // Update moveHistory with the inverted moves (i.e. as seen by the
         // opponent).
         invertedMoveHistory.push_back(Move(playedMove.m_you, playedMove.m_me));
      }

#ifdef DEBUG
      std::cout << (correctDelay*100.0) / moveHistory.size() << "  " << std::endl;
#endif

      // Determine if the noves played by our opponent matches that of DELAY.
      // If so, play whatever beats DELAY. Otherwise, just copy DELAY's strategy.
      if (correctCycle_3*2 > moveHistory.size())
         return beats(cycle_3.move(invertedMoveHistory));
      else if (correctNext*2 > moveHistory.size())
         return beats(next.move(invertedMoveHistory));
      else if (correctDelay_2*2 > moveHistory.size())
         return beats(delay_2.move(invertedMoveHistory));
      else if (correctDelay*2 > moveHistory.size())
         return beats(delay.move(invertedMoveHistory));
      else if (correctCopy*2 > moveHistory.size())
         return beats(copy.move(invertedMoveHistory));
      else
         return delay.move(moveHistory);

   }